

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::SetDirectoriesFromFile(cmake *this,string *arg)

{
  cmState *this_00;
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  cmValue dir;
  string *psVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  string fullPath;
  string path;
  string listPath;
  string name;
  string cachePath;
  string listFile;
  string cacheFile;
  
  listPath._M_dataplus._M_p = (pointer)&listPath.field_2;
  listPath._M_string_length = 0;
  listPath.field_2._M_local_buf[0] = '\0';
  cachePath._M_dataplus._M_p = (pointer)&cachePath.field_2;
  cachePath._M_string_length = 0;
  cachePath.field_2._M_local_buf[0] = '\0';
  bVar3 = cmsys::SystemTools::FileIsDirectory(arg);
  if (bVar3) {
    cmsys::SystemTools::CollapseFullPath(&path,arg);
    cmsys::SystemTools::ConvertToUnixSlashes(&path);
    fullPath._M_dataplus._M_p = (pointer)path._M_string_length;
    fullPath._M_string_length = (size_type)path._M_dataplus._M_p;
    name._M_dataplus._M_p = (pointer)0xf;
    name._M_string_length = (size_type)anon_var_dwarf_15e418;
    cmStrCat<>(&cacheFile,(cmAlphaNum *)&fullPath,(cmAlphaNum *)&name);
    fullPath._M_dataplus._M_p = (pointer)path._M_string_length;
    fullPath._M_string_length = (size_type)path._M_dataplus._M_p;
    name._M_dataplus._M_p = (pointer)0xf;
    name._M_string_length = (size_type)anon_var_dwarf_15e425;
    cmStrCat<>(&listFile,(cmAlphaNum *)&fullPath,(cmAlphaNum *)&name);
    bVar3 = cmsys::SystemTools::FileExists(&cacheFile);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&cachePath);
    }
    bVar4 = cmsys::SystemTools::FileExists(&listFile);
    if (bVar4) {
      bVar3 = true;
      std::__cxx11::string::_M_assign((string *)&listPath);
    }
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::~string((string *)&cacheFile);
    std::__cxx11::string::~string((string *)&path);
  }
  else {
    bVar3 = cmsys::SystemTools::FileExists(arg);
    if (bVar3) {
      cmsys::SystemTools::CollapseFullPath(&fullPath,arg);
      cmsys::SystemTools::GetFilenameName(&name,&fullPath);
      cmsys::SystemTools::LowerCase(&path,&name);
      std::__cxx11::string::operator=((string *)&name,(string *)&path);
      std::__cxx11::string::~string((string *)&path);
      __x._M_str = name._M_dataplus._M_p;
      __x._M_len = name._M_string_length;
      __y._M_str = "cmakecache.txt";
      __y._M_len = 0xe;
      bVar3 = std::operator==(__x,__y);
      if (bVar3) {
        cmsys::SystemTools::GetFilenamePath(&path,&fullPath);
        psVar7 = &cachePath;
        goto LAB_001748fa;
      }
      __x_02._M_str = name._M_dataplus._M_p;
      __x_02._M_len = name._M_string_length;
      __y_02._M_str = "cmakelists.txt";
      __y_02._M_len = 0xe;
      bVar3 = std::operator==(__x_02,__y_02);
      if (bVar3) {
        cmsys::SystemTools::GetFilenamePath(&path,&fullPath);
        goto LAB_001748f5;
      }
    }
    else {
      cmsys::SystemTools::CollapseFullPath(&fullPath,arg);
      cmsys::SystemTools::GetFilenameName(&name,&fullPath);
      cmsys::SystemTools::LowerCase(&path,&name);
      std::__cxx11::string::operator=((string *)&name,(string *)&path);
      std::__cxx11::string::~string((string *)&path);
      __x_00._M_str = name._M_dataplus._M_p;
      __x_00._M_len = name._M_string_length;
      __y_00._M_str = "cmakecache.txt";
      __y_00._M_len = 0xe;
      bVar3 = std::operator==(__x_00,__y_00);
      if (!bVar3) {
        __x_01._M_str = name._M_dataplus._M_p;
        __x_01._M_len = name._M_string_length;
        __y_01._M_str = "cmakelists.txt";
        __y_01._M_len = 0xe;
        bVar3 = std::operator==(__x_01,__y_01);
        if (!bVar3) {
          std::__cxx11::string::_M_assign((string *)&listPath);
          goto LAB_0017490f;
        }
      }
      cmsys::SystemTools::GetFilenamePath(&path,&fullPath);
LAB_001748f5:
      psVar7 = &listPath;
LAB_001748fa:
      std::__cxx11::string::operator=((string *)psVar7,(string *)&path);
      std::__cxx11::string::~string((string *)&path);
    }
LAB_0017490f:
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&fullPath);
    bVar3 = true;
    bVar4 = false;
  }
  if (cachePath._M_string_length != 0) {
    bVar5 = LoadCache(this,&cachePath);
    if (bVar5) {
      this_00 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullPath,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&name);
      dir = cmState::GetCacheEntryValue(this_00,&fullPath);
      std::__cxx11::string::~string((string *)&fullPath);
      if (dir.Value != (string *)0x0) {
        SetHomeOutputDirectory(this,&cachePath);
        bVar5 = true;
        SetHomeDirectory(this,dir.Value);
        goto LAB_00174afc;
      }
    }
  }
  psVar7 = GetHomeDirectory_abi_cxx11_(this);
  sVar1 = psVar7->_M_string_length;
  psVar7 = GetHomeOutputDirectory_abi_cxx11_(this);
  sVar2 = psVar7->_M_string_length;
  psVar7 = GetHomeDirectory_abi_cxx11_(this);
  _Var6 = std::operator==(&listPath,psVar7);
  bVar5 = true;
  if (!_Var6) {
    psVar7 = GetHomeOutputDirectory_abi_cxx11_(this);
    _Var6 = std::operator==(&listPath,psVar7);
    bVar5 = (bool)(_Var6 | bVar4 | sVar2 == 0);
  }
  if (listPath._M_string_length == 0) {
    if (sVar1 == 0) {
      cmsys::SystemTools::CollapseFullPath(&fullPath,arg);
      SetHomeDirectory(this,&fullPath);
      std::__cxx11::string::~string((string *)&fullPath);
    }
    else if ((sVar1 != 0) && (bVar3 == false && sVar2 == 0)) {
      cmsys::SystemTools::CollapseFullPath(&fullPath,arg);
      SetHomeOutputDirectory(this,&fullPath);
      goto LAB_00174af4;
    }
    if (sVar2 == 0) {
      cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
      SetHomeOutputDirectory(this,&fullPath);
      std::__cxx11::string::~string((string *)&fullPath);
      bVar5 = false;
    }
  }
  else {
    if (bVar4 == false) {
      if (sVar1 != 0 || sVar2 != 0) {
        if (sVar2 == 0) {
          SetHomeOutputDirectory(this,&listPath);
        }
        goto LAB_00174afc;
      }
      SetHomeDirectory(this,&listPath);
      cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
      SetHomeOutputDirectory(this,&fullPath);
    }
    else {
      SetHomeDirectoryViaCommandLine(this,&listPath);
      if (sVar2 != 0) goto LAB_00174afc;
      cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
      SetHomeOutputDirectory(this,&fullPath);
    }
LAB_00174af4:
    std::__cxx11::string::~string((string *)&fullPath);
  }
LAB_00174afc:
  std::__cxx11::string::~string((string *)&cachePath);
  std::__cxx11::string::~string((string *)&listPath);
  return bVar5;
}

Assistant:

bool cmake::SetDirectoriesFromFile(const std::string& arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool is_source_dir = false;
  bool is_empty_directory = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
    std::string listFile = cmStrCat(path, "/CMakeLists.txt");

    is_empty_directory = true;
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
      is_empty_directory = false;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
      is_empty_directory = false;
      is_source_dir = true;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s) {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s || name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      cmValue existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(*existingValue);
        return true;
      }
    }
  }

  bool no_source_tree = this->GetHomeDirectory().empty();
  bool no_build_tree = this->GetHomeOutputDirectory().empty();

  // When invoked with a path that points to an existing CMakeCache
  // This function is called multiple times with the same path
  const bool passed_same_path = (listPath == this->GetHomeDirectory()) ||
    (listPath == this->GetHomeOutputDirectory());
  bool used_provided_path =
    (passed_same_path || is_source_dir || no_build_tree);

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    // When invoked with a path that points to an existing CMakeCache
    // This function is called multiple times with the same path
    if (is_source_dir) {
      this->SetHomeDirectoryViaCommandLine(listPath);
      if (no_build_tree) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    } else if (no_source_tree && no_build_tree) {
      this->SetHomeDirectory(listPath);

      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
    } else if (no_build_tree) {
      this->SetHomeOutputDirectory(listPath);
    }
  } else {
    if (no_source_tree) {
      // We didn't find a CMakeLists.txt and it wasn't specified
      // with -S. Assume it is the path to the source tree
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeDirectory(full);
    }
    if (no_build_tree && !no_source_tree && is_empty_directory) {
      // passed `-S <path> <build_dir> when build_dir is an empty directory
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeOutputDirectory(full);
    } else if (no_build_tree) {
      // We didn't find a CMakeCache.txt and it wasn't specified
      // with -B. Assume the current working directory as the build tree.
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
      used_provided_path = false;
    }
  }

  return used_provided_path;
}